

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_cell_face_node(REF_GRID ref_grid,REF_INT node)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_NODE ref_node;
  REF_INT *pRVar3;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  REF_INT RVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  REF_INT face_nodes [4];
  REF_INT cell1;
  ulong local_48;
  REF_CELL local_40;
  REF_INT tri_cell;
  REF_INT cell0;
  
  ref_cell = ref_grid->cell[8];
  local_48 = 0xffffffff;
  RVar6 = -1;
  if (-1 < node) {
    pRVar2 = ref_cell->ref_adj;
    local_48 = 0xffffffff;
    RVar6 = -1;
    if (node < pRVar2->nnode) {
      uVar7 = pRVar2->first[(uint)node];
      local_48 = 0xffffffff;
      RVar6 = -1;
      if ((long)(int)uVar7 != -1) {
        RVar6 = pRVar2->item[(int)uVar7].ref;
        local_48 = (ulong)uVar7;
      }
    }
  }
  ref_node = ref_grid->node;
  local_40 = ref_grid->cell[3];
  do {
    if ((int)local_48 == -1) {
      return 0;
    }
    for (lVar9 = 0; lVar9 < ref_cell->face_per; lVar9 = lVar9 + 1) {
      pRVar3 = ref_cell->c2n;
      pRVar4 = ref_cell->f2n;
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        face_nodes[lVar8] =
             pRVar3[(long)ref_cell->size_per * (long)RVar6 +
                    (long)pRVar4[(ulong)((uint)lVar9 & 0x3fffffff) * 4 + lVar8]];
      }
      pRVar3 = ref_node->part;
      iVar1 = ref_node->ref_mpi->id;
      if ((((iVar1 == pRVar3[face_nodes[0]]) || (iVar1 == pRVar3[face_nodes[1]])) ||
          (iVar1 == pRVar3[face_nodes[2]])) || (iVar1 == pRVar3[face_nodes[3]])) {
        uVar7 = ref_cell_with_face(ref_cell,face_nodes,&cell0,&cell1);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x102,"ref_validation_cell_face_node",(ulong)uVar7,"two expected");
          ref_node_location(ref_node,face_nodes[0]);
          ref_node_location(ref_node,face_nodes[1]);
          ref_node_location(ref_node,face_nodes[2]);
          ref_node_location(ref_node,face_nodes[3]);
          ref_validation_node_cell(ref_cell,face_nodes[0]);
          ref_validation_node_cell(ref_cell,face_nodes[1]);
          ref_validation_node_cell(ref_cell,face_nodes[2]);
          return uVar7;
        }
        if ((cell1 == -1) && (uVar7 = ref_cell_with(local_40,face_nodes,&tri_cell), uVar7 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x109,"ref_validation_cell_face_node",(ulong)uVar7,"matching tri");
          ref_node_location(ref_node,face_nodes[0]);
          ref_node_location(ref_node,face_nodes[1]);
          ref_node_location(ref_node,face_nodes[2]);
          ref_node_location(ref_node,face_nodes[3]);
          return uVar7;
        }
      }
    }
    pRVar5 = ref_cell->ref_adj->item;
    local_48 = (ulong)pRVar5[(int)local_48].next;
    RVar6 = -1;
    if (local_48 != 0xffffffffffffffff) {
      RVar6 = pRVar5[local_48].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_face_node(REF_GRID ref_grid,
                                                 REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tet = ref_grid_tet(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_face;
  REF_INT face_node, face_nodes[4];
  REF_INT cell0, cell1, tri_cell;

  each_ref_cell_having_node(tet, node, item, cell) {
    each_ref_cell_cell_face(tet, cell_face) {
      for (face_node = 0; face_node < 4; face_node++) {
        face_nodes[face_node] = ref_cell_f2n(tet, face_node, cell_face, cell);
      }
      if (ref_node_owned(ref_node, face_nodes[0]) ||
          ref_node_owned(ref_node, face_nodes[1]) ||
          ref_node_owned(ref_node, face_nodes[2]) ||
          ref_node_owned(ref_node, face_nodes[3])) {
        RSB(ref_cell_with_face(tet, face_nodes, &cell0, &cell1), "two expected",
            {
              ref_node_location(ref_node, face_nodes[0]);
              ref_node_location(ref_node, face_nodes[1]);
              ref_node_location(ref_node, face_nodes[2]);
              ref_node_location(ref_node, face_nodes[3]);
              ref_validation_node_cell(tet, face_nodes[0]);
              ref_validation_node_cell(tet, face_nodes[1]);
              ref_validation_node_cell(tet, face_nodes[2]);
            });
        if (REF_EMPTY == cell1) { /* should have tri on other side */
          RSB(ref_cell_with(tri, face_nodes, &tri_cell), "matching tri", {
            ref_node_location(ref_node, face_nodes[0]);
            ref_node_location(ref_node, face_nodes[1]);
            ref_node_location(ref_node, face_nodes[2]);
            ref_node_location(ref_node, face_nodes[3]);
          });
        }
      }
    }
  }

  return REF_SUCCESS;
}